

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

void __thiscall
mini_bus::MiniBusClient::MiniBusClient
          (MiniBusClient *this,shared_ptr<mini_bus::ConnectionInfo> *info)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> __p;
  __uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> local_40;
  MiniBusClient *local_38;
  
  (this->is_running)._M_base._M_i = true;
  (this->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (info->super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (info->super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (info->super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  (info->super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  std::random_device::random_device(&this->rd);
  (this->dist)._M_param = (param_type)0xffffffff00000000;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var1 = &(this->reqmap)._M_t._M_impl.super__Rb_tree_header;
  (this->reqmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->reqmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reqmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reqmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->reqmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->evtmap)._M_t._M_impl.super__Rb_tree_header;
  (this->evtmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->evtmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->evtmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->evtmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->evtmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fnmap)._M_t._M_impl.super__Rb_tree_header;
  (this->fnmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fnmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fnmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fnmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fnmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->socket).
  super__Optional_base<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ._M_engaged = false;
  (this->work_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
  _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  local_38 = this;
  std::
  make_unique<std::thread,mini_bus::MiniBusClient::MiniBusClient(std::shared_ptr<mini_bus::ConnectionInfo>)::_lambda()_1_>
            ((anon_class_8_1_8991fb9c_for__M_head_impl *)&local_40);
  __p._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       local_40._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
       super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  local_40._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       (tuple<std::thread_*,_std::default_delete<std::thread>_>)
       (_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)0x0;
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&this->work_thread,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_40);
  return;
}

Assistant:

inline MiniBusClient(std::shared_ptr<ConnectionInfo> info) : info(std::move(info)) {
    work_thread = std::make_unique<std::thread>([this] { worker(); });
  }